

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void copy_suite::copy_string(void)

{
  undefined1 *puVar1;
  undefined1 local_1bb;
  undefined1 local_1ba [2];
  undefined1 local_1b8 [8];
  variable copy_3;
  variable data_3;
  undefined1 local_14b;
  undefined1 local_14a [2];
  undefined1 local_148 [8];
  variable copy_2;
  variable data_2;
  undefined1 local_db;
  undefined1 local_da [2];
  undefined1 local_d8 [8];
  variable copy_1;
  variable data_1;
  undefined1 local_68 [8];
  variable copy;
  variable data;
  
  puVar1 = &copy.storage.field_0x28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)puVar1,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_68,
             (basic_variable<std::allocator<char>_> *)puVar1);
  data_1.storage._42_1_ =
       trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::string>
                 ((basic_variable<std::allocator<char>_> *)local_68);
  data_1.storage._41_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("copy.is<string>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x676,"void copy_suite::copy_string()",&data_1.storage.field_0x2a,
             &data_1.storage.field_0x29);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&copy.storage.field_0x28);
  puVar1 = &copy_1.storage.field_0x28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)puVar1,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_d8,
             (basic_variable<std::allocator<char>_> *)puVar1);
  local_da[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::wstring>
                          ((basic_variable<std::allocator<char>_> *)local_d8);
  local_db = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("copy.is<wstring>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x67b,"void copy_suite::copy_string()",local_da,&local_db);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&copy_1.storage.field_0x28);
  puVar1 = &copy_2.storage.field_0x28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)puVar1,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_148,
             (basic_variable<std::allocator<char>_> *)puVar1);
  local_14a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::
                 is<trial::dynamic::u16string>((basic_variable<std::allocator<char>_> *)local_148);
  local_14b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("copy.is<u16string>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x680,"void copy_suite::copy_string()",local_14a,&local_14b);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_148);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&copy_2.storage.field_0x28);
  puVar1 = &copy_3.storage.field_0x28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)puVar1,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1b8,
             (basic_variable<std::allocator<char>_> *)puVar1);
  local_1ba[0] = trial::dynamic::basic_variable<std::allocator<char>_>::
                 is<trial::dynamic::u32string>((basic_variable<std::allocator<char>_> *)local_1b8);
  local_1bb = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("copy.is<u32string>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x685,"void copy_suite::copy_string()",local_1ba,&local_1bb);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&copy_3.storage.field_0x28);
  return;
}

Assistant:

void copy_string()
{
    {
        variable data("alpha");
        variable copy(data);
        TRIAL_PROTOCOL_TEST_EQUAL(copy.is<string>(), true);
    }
    {
        variable data(L"bravo");
        variable copy(data);
        TRIAL_PROTOCOL_TEST_EQUAL(copy.is<wstring>(), true);
    }
    {
        variable data(u"charlie");
        variable copy(data);
        TRIAL_PROTOCOL_TEST_EQUAL(copy.is<u16string>(), true);
    }
    {
        variable data(U"delta");
        variable copy(data);
        TRIAL_PROTOCOL_TEST_EQUAL(copy.is<u32string>(), true);
    }
}